

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_NtkCleanMap2(Cba_Ntk_t *p)

{
  Cba_Man_t *pCVar1;
  int i_00;
  int i;
  int i_01;
  
  pCVar1 = p->pDesign;
  for (i_01 = 0; i_01 < (pCVar1->vUsed2).nSize; i_01 = i_01 + 1) {
    i_00 = Vec_IntEntry(&pCVar1->vUsed2,i_01);
    Vec_IntWriteEntry(&pCVar1->vNameMap2,i_00,0);
  }
  (pCVar1->vUsed2).nSize = 0;
  return;
}

Assistant:

static inline void Cba_NtkCleanMap2( Cba_Ntk_t * p )               { Cba_ManCleanMap2(p->pDesign);         }